

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniminer_tests.cpp
# Opt level: O3

void miniminer_tests::calculate_cluster_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestOpts opts;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  calculate_cluster t;
  undefined8 in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  pointer in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 local_6a8 [112];
  ios_base local_638 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_508 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_80;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6b0 = "";
  memset((ostringstream *)local_508,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_508);
  local_390[0]._M_string_length = 0;
  local_390[0].field_2._M_local_buf[0] = '\0';
  local_6a8[0] = 0x22;
  local_390[0]._M_dataplus._M_p = (pointer)&local_390[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,local_6a8,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"calculate_cluster",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_508,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_390,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a8);
  if ((undefined1 *)local_6a8._0_8_ != local_6a8 + 0x10) {
    operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ + 1);
  }
  local_6c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390[0]._M_dataplus._M_p;
  local_6c0 = local_390[0]._M_dataplus._M_p + local_390[0]._M_string_length;
  file.m_end = (iterator)0x24c;
  file.m_begin = (iterator)&local_6b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_6c8,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390[0]._M_dataplus._M_p != &local_390[0].field_2) {
    operator_delete(local_390[0]._M_dataplus._M_p,
                    CONCAT71(local_390[0].field_2._M_allocated_capacity._1_7_,
                             local_390[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_508);
  std::ios_base::~ios_base((ios_base *)(local_508 + 0x70));
  local_6a8._0_8_ = (pointer)0x0;
  local_6a8._8_8_ = 0;
  local_6a8._16_8_ = 0;
  local_6a8._24_4_ = 0x1010101;
  local_6a8[0x1c] = '\0';
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff8c0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8b8;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff8c8;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff8d0;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff8d0 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff8d0 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff8d0 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff8d0 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff8d0 >> 0x28);
  TestChain100Setup::TestChain100Setup((TestChain100Setup *)local_508,REGTEST,opts);
  if ((pointer)local_6a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_6a8._0_8_,local_6a8._16_8_ - local_6a8._0_8_);
  }
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6d0 = "";
  memset((ostringstream *)local_6a8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
  paVar1 = &local_530.field_2;
  local_530._M_string_length = 0;
  local_530.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_530._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"calculate_cluster",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_530,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p;
  local_6e0 = local_530._M_dataplus._M_p + local_530._M_string_length;
  file_00.m_end = (iterator)0x24c;
  file_00.m_begin = (iterator)&local_6d8;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6e8,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != paVar1) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                             local_530.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
  std::ios_base::~ios_base(local_638);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_6f0 = "";
  memset((ostringstream *)local_6a8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
  local_530._M_string_length = 0;
  local_530.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_530._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"calculate_cluster",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_530,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_708 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p;
  local_700 = local_530._M_dataplus._M_p + local_530._M_string_length;
  file_01.m_end = (iterator)0x24c;
  file_01.m_begin = (iterator)&local_6f8;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_708,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != paVar1) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                             local_530.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
  std::ios_base::~ios_base(local_638);
  calculate_cluster::test_method((calculate_cluster *)local_508);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/miniminer_tests.cpp"
  ;
  local_710 = "";
  memset((ostringstream *)local_6a8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
  local_530._M_string_length = 0;
  local_530.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_530._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"calculate_cluster",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6a8,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_530,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_728 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p;
  local_720 = local_530._M_dataplus._M_p + local_530._M_string_length;
  file_02.m_end = (iterator)0x24c;
  file_02.m_begin = (iterator)&local_718;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_728,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != paVar1) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                             local_530.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
  std::ios_base::~ios_base(local_638);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_6a8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6a8);
  local_530._M_string_length = 0;
  local_530.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_530._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"calculate_cluster",0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6a8,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_530,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  file_03.m_end = (iterator)0x24c;
  file_03.m_begin = &stack0xfffffffffffff8c8;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar3,file_03,(size_t)&stack0xfffffffffffff8b8,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != paVar1) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT71(local_530.field_2._M_allocated_capacity._1_7_,
                             local_530.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6a8);
  std::ios_base::~ios_base(local_638);
  if (local_60._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
               local_60._M_head_impl);
  }
  local_60._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_80);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_508);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(calculate_cluster, TestChain100Setup)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    LOCK2(cs_main, pool.cs);

    // TODO this can be removed once the mempool interface uses Txid, Wtxid
    auto convert_to_uint256_vec = [](const std::vector<Txid>& vec) -> std::vector<uint256> {
        std::vector<uint256> out;
        std::transform(vec.begin(), vec.end(), std::back_inserter(out),
                       [](const Txid& txid) { return txid.ToUint256(); });
        return out;
    };

    // Add chain of size 500
    TestMemPoolEntryHelper entry;
    std::vector<Txid> chain_txids;
    auto& lasttx = m_coinbase_txns[0];
    for (auto i{0}; i < 500; ++i) {
        const auto tx = make_tx({COutPoint{lasttx->GetHash(), 0}}, /*num_outputs=*/1);
        pool.addUnchecked(entry.Fee(CENT).FromTx(tx));
        chain_txids.push_back(tx->GetHash());
        lasttx = tx;
    }
    const auto cluster_500tx = pool.GatherClusters({lasttx->GetHash()});
    CTxMemPool::setEntries cluster_500tx_set{cluster_500tx.begin(), cluster_500tx.end()};
    BOOST_CHECK_EQUAL(cluster_500tx.size(), cluster_500tx_set.size());
    const auto vec_iters_500 = pool.GetIterVec(convert_to_uint256_vec(chain_txids));
    for (const auto& iter : vec_iters_500) BOOST_CHECK(cluster_500tx_set.count(iter));

    // GatherClusters stops at 500 transactions.
    const auto tx_501 = make_tx({COutPoint{lasttx->GetHash(), 0}}, /*num_outputs=*/1);
    pool.addUnchecked(entry.Fee(CENT).FromTx(tx_501));
    const auto cluster_501 = pool.GatherClusters({tx_501->GetHash()});
    BOOST_CHECK_EQUAL(cluster_501.size(), 0);

    /* Zig Zag cluster:
     * txp0     txp1     txp2    ...  txp48  txp49
     *    \    /    \   /   \            \   /
     *     txc0     txc1    txc2  ...    txc48
     * Note that each transaction's ancestor size is 1 or 3, and each descendant size is 1, 2 or 3.
     * However, all of these transactions are in the same cluster. */
    std::vector<Txid> zigzag_txids;
    for (auto p{0}; p < 50; ++p) {
        const auto txp = make_tx({COutPoint{Txid::FromUint256(GetRandHash()), 0}}, /*num_outputs=*/2);
        pool.addUnchecked(entry.Fee(CENT).FromTx(txp));
        zigzag_txids.push_back(txp->GetHash());
    }
    for (auto c{0}; c < 49; ++c) {
        const auto txc = make_tx({COutPoint{zigzag_txids[c], 1}, COutPoint{zigzag_txids[c+1], 0}}, /*num_outputs=*/1);
        pool.addUnchecked(entry.Fee(CENT).FromTx(txc));
        zigzag_txids.push_back(txc->GetHash());
    }
    const auto vec_iters_zigzag = pool.GetIterVec(convert_to_uint256_vec(zigzag_txids));
    // It doesn't matter which tx we calculate cluster for, everybody is in it.
    const std::vector<size_t> indices{0, 22, 72, zigzag_txids.size() - 1};
    for (const auto index : indices) {
        const auto cluster = pool.GatherClusters({zigzag_txids[index]});
        BOOST_CHECK_EQUAL(cluster.size(), zigzag_txids.size());
        CTxMemPool::setEntries clusterset{cluster.begin(), cluster.end()};
        BOOST_CHECK_EQUAL(cluster.size(), clusterset.size());
        for (const auto& iter : vec_iters_zigzag) BOOST_CHECK(clusterset.count(iter));
    }
}